

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void dpfb::args::getValue(char ***cursor,char **optArgsEnd,int *var)

{
  long lVar1;
  char *local_28;
  char *end;
  int *var_local;
  char **optArgsEnd_local;
  char ***cursor_local;
  
  end = (char *)var;
  var_local = (int *)optArgsEnd;
  optArgsEnd_local = (char **)cursor;
  advanceToArg(cursor,optArgsEnd);
  lVar1 = strtol(*(char **)*optArgsEnd_local,&local_28,10);
  *(int *)end = (int)lVar1;
  if (*(char **)*optArgsEnd_local == local_28) {
    fprintf(_stderr,"Invalid %s: %s\n",*(undefined8 *)(*optArgsEnd_local + -8),
            *(undefined8 *)*optArgsEnd_local);
    exit(1);
  }
  return;
}

Assistant:

static void getValue(char**& cursor, char** optArgsEnd, int& var)
{
    advanceToArg(cursor, optArgsEnd);

    char* end;
    var = std::strtol(*cursor, &end, 10);
    if (*cursor == end) {
        std::fprintf(stderr, "Invalid %s: %s\n", *(cursor - 1), *cursor);
        std::exit(EXIT_FAILURE);
    }
}